

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

void ImDrawList_PathLineToMergeDuplicate(ImDrawList *self,ImVec2 pos)

{
  ImVec2 *__src;
  ImVec2 *__dest;
  int iVar1;
  int iVar2;
  
  iVar1 = (self->_Path).Size;
  if ((long)iVar1 == 0) {
    if ((self->_Path).Capacity != 0) {
      __dest = (self->_Path).Data;
      iVar1 = 0;
      goto LAB_0012a857;
    }
    iVar1 = 8;
    iVar2 = 1;
  }
  else {
    __dest = (self->_Path).Data;
    if (__dest[(long)iVar1 + -1] == pos) {
      return;
    }
    if (iVar1 != (self->_Path).Capacity) goto LAB_0012a857;
    iVar2 = iVar1 + 1;
    iVar1 = iVar1 / 2 + iVar1;
  }
  if (iVar2 < iVar1) {
    iVar2 = iVar1;
  }
  __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar2 << 3);
  __src = (self->_Path).Data;
  if (__src != (ImVec2 *)0x0) {
    memcpy(__dest,__src,(long)(self->_Path).Size << 3);
    ImGui::MemFree((self->_Path).Data);
  }
  (self->_Path).Data = __dest;
  (self->_Path).Capacity = iVar2;
  iVar1 = (self->_Path).Size;
LAB_0012a857:
  __dest[iVar1] = pos;
  (self->_Path).Size = (self->_Path).Size + 1;
  return;
}

Assistant:

CIMGUI_API void ImDrawList_PathLineToMergeDuplicate(ImDrawList* self,const ImVec2 pos)
{
    return self->PathLineToMergeDuplicate(pos);
}